

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O0

int loader_impl_function_hook_call(context ctx,char *func_name)

{
  int iVar1;
  value pvVar2;
  function_return v;
  context in_RDI;
  int result;
  function_return ret;
  void *null_args [1];
  function func_init;
  value val;
  scope sp;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  void **in_stack_ffffffffffffffc0;
  function_conflict in_stack_ffffffffffffffc8;
  function local_30;
  
  context_scope(in_RDI);
  pvVar2 = scope_get((scope)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (char *)0x132b1c);
  local_30 = (function)0x0;
  if (pvVar2 != (value)0x0) {
    local_30 = value_to_function(in_stack_ffffffffffffffc0);
  }
  if (local_30 != (function)0x0) {
    memset(&stack0xffffffffffffffc8,0,8);
    v = function_call(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (v != (function_return)0x0) {
      iVar1 = value_to_int(v);
      value_destroy(v);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

int loader_impl_function_hook_call(context ctx, const char func_name[])
{
	scope sp = context_scope(ctx);

	value val = scope_get(sp, func_name);

	function func_init = NULL;

	if (val != NULL)
	{
		func_init = value_to_function(val);
	}

	if (func_init != NULL)
	{
		void *null_args[1] = { NULL };

		function_return ret = function_call(func_init, null_args, 0);

		if (ret != NULL)
		{
			int result = value_to_int(ret);

			value_destroy(ret);

			return result;
		}
	}

	return 0;
}